

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O1

string * EncodeBase32_abi_cxx11_
                   (string *__return_storage_ptr__,Span<const_unsigned_char> input,bool pad)

{
  long lVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  long in_FS_OFFSET;
  
  sVar3 = input.m_size;
  pbVar7 = input.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar3 + 4;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             SUB168(auVar2 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffffffffffff8);
  if (sVar3 == 0) {
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    pbVar6 = pbVar7 + sVar3;
    uVar5 = 0;
    uVar4 = 0;
    do {
      uVar5 = (ulong)(((uint)uVar5 & 0xf) << 8) | (ulong)*pbVar7;
      uVar4 = uVar4 + 8;
      do {
        uVar4 = uVar4 - 5;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,
                   "abcdefghijklmnopqrstuvwxyz234567"[(uint)(uVar5 >> ((byte)uVar4 & 0x3f)) & 0x1f])
        ;
      } while (4 < uVar4);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar6);
  }
  if (uVar4 != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,
               "abcdefghijklmnopqrstuvwxyz234567"[(uint)(uVar5 << (5U - (char)uVar4 & 0x3f)) & 0x1f]
              );
  }
  if (pad) {
    while ((__return_storage_ptr__->_M_string_length & 7) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,'=');
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncodeBase32(Span<const unsigned char> input, bool pad)
{
    static const char *pbase32 = "abcdefghijklmnopqrstuvwxyz234567";

    std::string str;
    str.reserve(((input.size() + 4) / 5) * 8);
    ConvertBits<8, 5, true>([&](int v) { str += pbase32[v]; }, input.begin(), input.end());
    if (pad) {
        while (str.size() % 8) {
            str += '=';
        }
    }
    return str;
}